

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simMan.c
# Opt level: O1

void Sym_ManStop(Sym_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  Vec_Vec_t *__ptr;
  void *__ptr_00;
  Vec_Int_t *pVVar2;
  long lVar3;
  
  Sym_ManPrintStats(p);
  if (p->vSuppFun != (Vec_Ptr_t *)0x0) {
    Sim_UtilInfoFree(p->vSuppFun);
  }
  if (p->vSim != (Vec_Ptr_t *)0x0) {
    Sim_UtilInfoFree(p->vSim);
  }
  pVVar1 = p->vNodes;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    free(pVVar1);
  }
  __ptr = p->vSupports;
  if (__ptr != (Vec_Vec_t *)0x0) {
    if (0 < __ptr->nSize) {
      lVar3 = 0;
      do {
        __ptr_00 = __ptr->pArray[lVar3];
        if (__ptr_00 != (void *)0x0) {
          if (*(void **)((long)__ptr_00 + 8) != (void *)0x0) {
            free(*(void **)((long)__ptr_00 + 8));
            *(undefined8 *)((long)__ptr_00 + 8) = 0;
          }
          free(__ptr_00);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < __ptr->nSize);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    free(__ptr);
  }
  if (0 < p->nOutputs) {
    lVar3 = 0;
    do {
      Extra_BitMatrixStop((Extra_BitMat_t *)p->vMatrSymms->pArray[lVar3]);
      Extra_BitMatrixStop((Extra_BitMat_t *)p->vMatrNonSymms->pArray[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 < p->nOutputs);
  }
  pVVar2 = p->vVarsU;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vVarsV;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar1 = p->vMatrSymms;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vMatrNonSymms;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar2 = p->vPairsTotal;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vPairsSym;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vPairsNonSym;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  if (p->uPatRand != (uint *)0x0) {
    free(p->uPatRand);
    p->uPatRand = (uint *)0x0;
  }
  if (p->uPatCol != (uint *)0x0) {
    free(p->uPatCol);
    p->uPatCol = (uint *)0x0;
  }
  if (p->uPatRow != (uint *)0x0) {
    free(p->uPatRow);
    p->uPatRow = (uint *)0x0;
  }
  if (p != (Sym_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Sym_ManStop( Sym_Man_t * p )
{
    int i;
    Sym_ManPrintStats( p );
    if ( p->vSuppFun )     Sim_UtilInfoFree( p->vSuppFun );   
    if ( p->vSim )         Sim_UtilInfoFree( p->vSim );   
    if ( p->vNodes )       Vec_PtrFree( p->vNodes );
    if ( p->vSupports )    Vec_VecFree( p->vSupports );
    for ( i = 0; i < p->nOutputs; i++ )
    {
        Extra_BitMatrixStop( (Extra_BitMat_t *)p->vMatrSymms->pArray[i] );
        Extra_BitMatrixStop( (Extra_BitMat_t *)p->vMatrNonSymms->pArray[i] );
    }
    Vec_IntFree( p->vVarsU );
    Vec_IntFree( p->vVarsV );
    Vec_PtrFree( p->vMatrSymms );
    Vec_PtrFree( p->vMatrNonSymms );
    Vec_IntFree( p->vPairsTotal );
    Vec_IntFree( p->vPairsSym );
    Vec_IntFree( p->vPairsNonSym );
    ABC_FREE( p->uPatRand );
    ABC_FREE( p->uPatCol );
    ABC_FREE( p->uPatRow );
    ABC_FREE( p );
}